

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O1

void check_pragma(c2m_ctx_t c2m_ctx,token_t t,VARR_token_t *tokens)

{
  c2m_ctx_t pcVar1;
  short sVar2;
  ulong uVar3;
  token_t *pptVar4;
  undefined8 uVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  undefined4 *puVar9;
  c2m_ctx_t pcVar10;
  char *pcVar11;
  char *pcVar12;
  node_t pnVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  c2m_ctx_t pcVar16;
  char *pcVar17;
  node_t_conflict pnVar18;
  short *unaff_R12;
  c2m_ctx_t pcVar19;
  ulong uVar20;
  ulong uVar21;
  c2m_ctx_t pcVar22;
  bool bVar23;
  val vVar24;
  pos_t pVar25;
  val vStack_108;
  val vStack_f8;
  char *pcStack_e8;
  short *psStack_e0;
  c2m_ctx_t pcStack_d8;
  c2m_ctx_t pcStack_d0;
  c2m_ctx_t pcStack_c8;
  c2m_ctx_t pcStack_b8;
  c2m_ctx_t pcStack_b0;
  pre_ctx *ppStack_a8;
  undefined8 uStack_a0;
  undefined8 uStack_98;
  macro_t pmStack_90;
  macro mStack_88;
  
  if (tokens == (VARR_token_t *)0x0) {
    check_pragma_cold_1();
    pcStack_b0 = c2m_ctx;
    if ((c2m_ctx_t)t != (c2m_ctx_t)0x0) {
      ppStack_a8 = c2m_ctx->pre_ctx;
      pcVar22 = (c2m_ctx_t)&DAT_00000001;
      iVar6 = 0;
      pcStack_b8 = (c2m_ctx_t)t;
      do {
        pcVar1 = (c2m_ctx_t)((long)&pcVar22[-1].gen_ctx + 7);
        pcVar19 = (c2m_ctx_t)((c2m_ctx_t)t)->ctx;
        if (pcVar19 <= pcVar1) {
          return;
        }
        pnVar13 = (node_t)((c2m_ctx_t)t)->env[0].__jmpbuf[0];
        if (pnVar13 == (node_t)0x0) {
          pcStack_c8 = (c2m_ctx_t)0x1953ec;
          replace_defined_cold_3();
          pcVar17 = (char *)0x0;
LAB_001953ec:
          pcStack_c8 = (c2m_ctx_t)0x1953f1;
          replace_defined_cold_2();
          pcVar10 = c2m_ctx;
          c2m_ctx = pcVar19;
LAB_001953f1:
          pcStack_c8 = (c2m_ctx_t)eval;
          replace_defined_cold_1();
          pcStack_e8 = pcVar17;
          psStack_e0 = unaff_R12;
          pcStack_d8 = c2m_ctx;
          pcStack_d0 = pcVar1;
          pcStack_c8 = pcVar22;
          switch(*(node_code_t *)&((c2m_ctx_t)t)->ctx) {
          case N_IGNORE:
            pVar25 = get_node_pos(pcVar10,(node_t_conflict)t);
            error(pcVar10,0x1c3235,pVar25.fname,pVar25._8_8_);
            return;
          case N_I:
          case N_L:
          case N_LL:
            return;
          case N_U:
          case N_UL:
          case N_ULL:
          case N_CH16:
          case N_CH32:
            return;
          default:
            __assert_fail("FALSE",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                          ,0xddc,"struct val eval(c2m_ctx_t, node_t)");
          case N_CH:
            return;
          case N_ANDAND:
          case N_OROR:
            vVar24 = eval(pcVar10,(node_t_conflict)((c2m_ctx_t)t)->env[0].__jmpbuf[2]);
            vStack_108.u = vVar24.u;
            vStack_108.uns_p = vVar24.uns_p;
            if (*(node_code_t *)&((c2m_ctx_t)t)->ctx == N_ANDAND) {
              if (vStack_108.u.i_val == 0) {
                return;
              }
            }
            else if (vStack_108.u.i_val != 0) {
              return;
            }
            pnVar18 = (node_t_conflict)((c2m_ctx_t)t)->env[0].__jmpbuf[2];
            if (pnVar18 != (node_t_conflict)0x0) {
              pnVar18 = (pnVar18->op_link).next;
            }
            eval(pcVar10,pnVar18);
            return;
          case N_EQ:
            eval_binop_operands(pcVar10,(node_t_conflict)t,&vStack_108,&vStack_f8);
            return;
          case N_NE:
            eval_binop_operands(pcVar10,(node_t_conflict)t,&vStack_108,&vStack_f8);
            return;
          case N_LT:
            eval_binop_operands(pcVar10,(node_t_conflict)t,&vStack_108,&vStack_f8);
            return;
          case N_LE:
            eval_binop_operands(pcVar10,(node_t_conflict)t,&vStack_108,&vStack_f8);
            return;
          case N_GT:
            eval_binop_operands(pcVar10,(node_t_conflict)t,&vStack_108,&vStack_f8);
            return;
          case N_GE:
            eval_binop_operands(pcVar10,(node_t_conflict)t,&vStack_108,&vStack_f8);
            return;
          case N_BITWISE_NOT:
            eval(pcVar10,(node_t_conflict)((c2m_ctx_t)t)->env[0].__jmpbuf[2]);
            return;
          case N_NOT:
            eval(pcVar10,(node_t_conflict)((c2m_ctx_t)t)->env[0].__jmpbuf[2]);
            return;
          case N_AND:
            eval_binop_operands(pcVar10,(node_t_conflict)t,&vStack_108,&vStack_f8);
            return;
          case N_OR:
            eval_binop_operands(pcVar10,(node_t_conflict)t,&vStack_108,&vStack_f8);
            return;
          case N_XOR:
            eval_binop_operands(pcVar10,(node_t_conflict)t,&vStack_108,&vStack_f8);
            return;
          case N_LSH:
            eval_binop_operands(pcVar10,(node_t_conflict)t,&vStack_108,&vStack_f8);
            return;
          case N_RSH:
            eval_binop_operands(pcVar10,(node_t_conflict)t,&vStack_108,&vStack_f8);
            return;
          case N_ADD:
            pnVar18 = (node_t_conflict)((c2m_ctx_t)t)->env[0].__jmpbuf[2];
            if ((pnVar18 != (node_t_conflict)0x0) && ((pnVar18->op_link).next != (node_t)0x0)) {
              eval_binop_operands(pcVar10,(node_t_conflict)t,&vStack_108,&vStack_f8);
              return;
            }
            eval(pcVar10,pnVar18);
            return;
          case N_SUB:
            pnVar18 = (node_t_conflict)((c2m_ctx_t)t)->env[0].__jmpbuf[2];
            if ((pnVar18 != (node_t_conflict)0x0) && ((pnVar18->op_link).next != (node_t)0x0)) {
              eval_binop_operands(pcVar10,(node_t_conflict)t,&vStack_108,&vStack_f8);
              return;
            }
            eval(pcVar10,pnVar18);
            return;
          case N_MUL:
            eval_binop_operands(pcVar10,(node_t_conflict)t,&vStack_108,&vStack_f8);
            return;
          case N_DIV:
          case N_MOD:
            iVar6 = eval_binop_operands(pcVar10,(node_t_conflict)t,&vStack_108,&vStack_f8);
            bVar23 = vStack_f8.u.i_val == 0;
            if (iVar6 == 0) {
              if (vStack_f8.u.i_val != 0) {
                bVar23 = false;
              }
            }
            else if (vStack_f8.u.i_val != 0) {
              bVar23 = false;
            }
            if (!bVar23) {
              return;
            }
            pVar25 = get_node_pos(pcVar10,(node_t_conflict)t);
            pcVar17 = "%";
            if (*(node_code_t *)&((c2m_ctx_t)t)->ctx == N_DIV) {
              pcVar17 = "/";
            }
            error(pcVar10,0x1c3253,pVar25.fname,pVar25._8_8_,pcVar17);
            return;
          case N_COND:
            goto switchD_00195423_caseD_37;
          }
        }
        unaff_R12 = *(short **)((long)pnVar13 + (long)pcVar22 * 8 + -8);
        if (*unaff_R12 == 0x103) {
          c2m_ctx = *(c2m_ctx_t *)(unaff_R12 + 0x14);
          pcStack_c8 = (c2m_ctx_t)0x1951db;
          iVar7 = strcmp((char *)c2m_ctx,"defined");
          t = (token_t)pcStack_b8;
          if (iVar7 == 0) {
            pcVar16 = pcVar22;
            if ((pcVar22 < pcVar19) && (**(short **)(&pnVar13->code + (long)pcVar22 * 2) == 0x20)) {
              pcVar16 = (c2m_ctx_t)((long)&pcVar22->ctx + 1);
            }
            if (pcVar16 < pcVar19) {
              sVar2 = *(short *)*(token_t *)(&pnVar13->code + (long)pcVar16 * 2);
              if (sVar2 == 0x28) {
                pcVar10 = (c2m_ctx_t)((long)&pcVar16->ctx + 1);
                if ((pcVar10 < pcVar19) && (*(&pnVar13->attr)[(long)pcVar16] == 0x20)) {
                  pcVar10 = (c2m_ctx_t)((long)&pcVar16->ctx + 2);
                }
                if ((pcVar10 < pcVar19) &&
                   (*(short *)*(token_t *)(&pnVar13->code + (long)pcVar10 * 2) == 0x103)) {
                  c2m_ctx = (c2m_ctx_t)((long)&pcVar10->ctx + 1);
                  if ((c2m_ctx < pcVar19) && (*(&pnVar13->attr)[(long)pcVar10] == 0x20)) {
                    c2m_ctx = (c2m_ctx_t)((long)&pcVar10->ctx + 2);
                  }
                  if ((c2m_ctx < pcVar19) &&
                     (**(short **)(&pnVar13->code + (long)c2m_ctx * 2) == 0x29)) {
                    pcStack_c8 = (c2m_ctx_t)0x19535a;
                    mStack_88.id = *(token_t *)(&pnVar13->code + (long)pcVar10 * 2);
                    iVar7 = HTAB_macro_t_do(ppStack_a8->macro_tab,&mStack_88,HTAB_FIND,&pmStack_90);
                    pcVar17 = "0";
                    if (iVar7 != 0) {
                      pcVar17 = "1";
                    }
                    uStack_a0 = *(undefined8 *)(unaff_R12 + 4);
                    uStack_98 = *(undefined8 *)(unaff_R12 + 8);
                    t = (token_t)0x30;
                    pcStack_c8 = (c2m_ctx_t)0x195388;
                    puVar9 = (undefined4 *)reg_malloc(pcStack_b0,0x30);
                    *puVar9 = 0x100;
                    *(undefined8 *)(puVar9 + 2) = uStack_a0;
                    *(undefined8 *)(puVar9 + 4) = uStack_98;
                    *(char **)(puVar9 + 10) = pcVar17;
                    puVar9[6] = 0;
                    *(undefined8 *)(puVar9 + 8) = 0;
                    pnVar13 = (node_t)pcStack_b8->env[0].__jmpbuf[0];
                    pcVar10 = pcStack_b8;
                    if ((pnVar13 == (node_t)0x0) ||
                       (pcVar16 = c2m_ctx, (c2m_ctx_t)pcStack_b8->ctx <= pcVar1)) goto LAB_001953f1;
                    goto LAB_001952b7;
                  }
                }
              }
              else if (sVar2 == 0x103) {
                pcStack_c8 = (c2m_ctx_t)0x19524a;
                mStack_88.id = *(token_t *)(&pnVar13->code + (long)pcVar16 * 2);
                iVar7 = HTAB_macro_t_do(ppStack_a8->macro_tab,&mStack_88,HTAB_FIND,&pmStack_90);
                pcVar17 = "0";
                if (iVar7 != 0) {
                  pcVar17 = "1";
                }
                uStack_a0 = *(undefined8 *)(unaff_R12 + 4);
                uStack_98 = *(undefined8 *)(unaff_R12 + 8);
                t = (token_t)0x30;
                pcStack_c8 = (c2m_ctx_t)0x195278;
                puVar9 = (undefined4 *)reg_malloc(pcStack_b0,0x30);
                *puVar9 = 0x100;
                *(undefined8 *)(puVar9 + 2) = uStack_a0;
                *(undefined8 *)(puVar9 + 4) = uStack_98;
                *(char **)(puVar9 + 10) = pcVar17;
                puVar9[6] = 0;
                *(undefined8 *)(puVar9 + 8) = 0;
                pnVar13 = (node_t)pcStack_b8->env[0].__jmpbuf[0];
                c2m_ctx = pcStack_b8;
                pcVar19 = pcVar16;
                if ((pnVar13 == (node_t)0x0) || ((c2m_ctx_t)pcStack_b8->ctx <= pcVar1))
                goto LAB_001953ec;
LAB_001952b7:
                *(undefined4 **)((long)pnVar13 + (long)pcVar22 * 8 + -8) = puVar9;
                pcStack_c8 = (c2m_ctx_t)0x1952c9;
                c2m_ctx = pcStack_b8;
                del_tokens((VARR_token_t *)pcStack_b8,(int)pcVar22,(int)pcVar16 + iVar6);
                t = (token_t)pcStack_b8;
              }
            }
          }
        }
        pcVar22 = (c2m_ctx_t)((long)&pcVar22->ctx + 1);
        iVar6 = iVar6 + -1;
      } while ((c2m_ctx_t)t != (c2m_ctx_t)0x0);
    }
    pcStack_c8 = (c2m_ctx_t)0x1953d8;
    replace_defined_cold_4();
    return;
  }
  uVar3 = tokens->els_num;
  pptVar4 = tokens->varr;
  if (uVar3 == 0) {
    uVar20 = 0;
  }
  else {
    uVar20 = (ulong)(*(short *)*pptVar4 == 0x20);
  }
  if (((uVar3 <= uVar20) || (*(short *)pptVar4[uVar20] != 0x103)) ||
     (iVar6 = strcmp(pptVar4[uVar20]->repr,"STDC"), iVar6 != 0)) {
    uVar5._0_4_ = (t->pos).lno;
    uVar5._4_4_ = (t->pos).ln_pos;
    warning(c2m_ctx,0x1c3532,(t->pos).fname,uVar5);
    return;
  }
  uVar21 = uVar20 + 1;
  if ((uVar21 < uVar3) && (*(short *)pptVar4[uVar20 + 1] == 0x20)) {
    uVar21 = uVar20 | 2;
  }
  if ((uVar21 < uVar3) && (*(short *)pptVar4[uVar21] == 0x103)) {
    pcVar17 = pptVar4[uVar21]->repr;
    iVar6 = strcmp(pcVar17,"FP_CONTRACT");
    if (((iVar6 != 0) && (iVar6 = strcmp(pcVar17,"FENV_ACCESS"), iVar6 != 0)) &&
       (iVar6 = strcmp(pcVar17,"CX_LIMITED_RANGE"), iVar6 != 0)) {
      pcVar12 = (t->pos).fname;
      uVar14._0_4_ = (t->pos).lno;
      uVar14._4_4_ = (t->pos).ln_pos;
      pcVar11 = "unknown STDC pragma %s";
LAB_00195040:
      error(c2m_ctx,pcVar11,pcVar12,uVar14,pcVar17);
      return;
    }
    uVar20 = uVar21 + 1;
    if ((uVar20 < uVar3) && (*(short *)pptVar4[uVar21 + 1] == 0x20)) {
      uVar20 = uVar21 + 2;
    }
    if ((uVar20 < uVar3) && (*(short *)pptVar4[uVar20] == 0x103)) {
      pcVar17 = pptVar4[uVar20]->repr;
      iVar6 = strcmp(pcVar17,"ON");
      if (((iVar6 != 0) && (iVar6 = strcmp(pcVar17,"OFF"), iVar6 != 0)) &&
         (iVar6 = strcmp(pcVar17,"DEFAULT"), iVar6 != 0)) {
        pcVar12 = (t->pos).fname;
        uVar14._0_4_ = (t->pos).lno;
        uVar14._4_4_ = (t->pos).ln_pos;
        pcVar11 = "unknown STDC pragma value";
        goto LAB_00195040;
      }
      uVar21 = uVar20 + 1;
      if ((uVar21 < uVar3) &&
         ((*(short *)pptVar4[uVar20 + 1] == 0x20 || (*(short *)pptVar4[uVar20 + 1] == 10)))) {
        uVar21 = uVar20 + 2;
      }
      if (uVar3 <= uVar21) {
        return;
      }
      pcVar17 = (t->pos).fname;
      uVar15._0_4_ = (t->pos).lno;
      uVar15._4_4_ = (t->pos).ln_pos;
      pcVar12 = "garbage at STDC pragma end";
    }
    else {
      pcVar17 = (t->pos).fname;
      uVar15._0_4_ = (t->pos).lno;
      uVar15._4_4_ = (t->pos).ln_pos;
      pcVar12 = "wrong STDC pragma value";
    }
  }
  else {
    pcVar17 = (t->pos).fname;
    uVar15._0_4_ = (t->pos).lno;
    uVar15._4_4_ = (t->pos).ln_pos;
    pcVar12 = "wrong STDC pragma";
  }
  error(c2m_ctx,pcVar12,pcVar17,uVar15);
  return;
switchD_00195423_caseD_37:
  vVar24 = eval(pcVar10,(node_t_conflict)((c2m_ctx_t)t)->env[0].__jmpbuf[2]);
  vStack_108.u = vVar24.u;
  vStack_108.uns_p = vVar24.uns_p;
  pnVar18 = (node_t_conflict)((c2m_ctx_t)t)->env[0].__jmpbuf[2];
  if (pnVar18 != (node_t_conflict)0x0) {
    uVar8 = (uint)(vStack_108.u.i_val == 0);
    do {
      pnVar18 = (pnVar18->op_link).next;
      bVar23 = uVar8 != 0;
      uVar8 = uVar8 - 1;
      if (pnVar18 == (node_t)0x0) break;
    } while (bVar23);
  }
  eval(pcVar10,pnVar18);
  return;
}

Assistant:

static void check_pragma (c2m_ctx_t c2m_ctx, token_t t, VARR (token_t) * tokens) {
  token_t *tokens_arr = VARR_ADDR (token_t, tokens);
  size_t i, tokens_len = VARR_LENGTH (token_t, tokens);

  i = 0;
  if (i < tokens_len && tokens_arr[i]->code == ' ') i++;
#ifdef _WIN32
  if (i + 1 == tokens_len && tokens_arr[i]->code == T_ID
      && strcmp (tokens_arr[i]->repr, "once") == 0) {
    pre_ctx_t pre_ctx = c2m_ctx->pre_ctx;
    VARR_PUSH (char_ptr_t, once_include_files, cs->fname);
    return;
  }
#endif
  if (i >= tokens_len || tokens_arr[i]->code != T_ID || strcmp (tokens_arr[i]->repr, "STDC") != 0) {
    warning (c2m_ctx, t->pos, "unknown pragma");
    return;
  }
  i++;
  if (i < tokens_len && tokens_arr[i]->code == ' ') i++;
  if (i >= tokens_len || tokens_arr[i]->code != T_ID) {
    error (c2m_ctx, t->pos, "wrong STDC pragma");
    return;
  }
  if (strcmp (tokens_arr[i]->repr, "FP_CONTRACT") != 0
      && strcmp (tokens_arr[i]->repr, "FENV_ACCESS") != 0
      && strcmp (tokens_arr[i]->repr, "CX_LIMITED_RANGE") != 0) {
    error (c2m_ctx, t->pos, "unknown STDC pragma %s", tokens_arr[i]->repr);
    return;
  }
  i++;
  if (i < tokens_len && tokens_arr[i]->code == ' ') i++;
  if (i >= tokens_len || tokens_arr[i]->code != T_ID) {
    error (c2m_ctx, t->pos, "wrong STDC pragma value");
    return;
  }
  if (strcmp (tokens_arr[i]->repr, "ON") != 0 && strcmp (tokens_arr[i]->repr, "OFF") != 0
      && strcmp (tokens_arr[i]->repr, "DEFAULT") != 0) {
    error (c2m_ctx, t->pos, "unknown STDC pragma value", tokens_arr[i]->repr);
    return;
  }
  i++;
  if (i < tokens_len && (tokens_arr[i]->code == ' ' || tokens_arr[i]->code == '\n')) i++;
  if (i < tokens_len) error (c2m_ctx, t->pos, "garbage at STDC pragma end");
}